

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_op
          (irGenerator *this,LeftVal *dest,RightVal *op1,RightVal *op2,Op op)

{
  uint32_t uVar1;
  VarId *__p;
  OpInst *this_00;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_01;
  undefined1 auStack_108 [28];
  Op local_ec;
  shared_ptr<mir::inst::OpInst> opInst;
  shared_ptr<mir::inst::Value> op2Value;
  shared_ptr<mir::inst::Value> op1Value;
  shared_ptr<mir::inst::VarId> destVarId;
  VarId local_a8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  Value local_70;
  Value local_50;
  
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  op1Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  op1Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  op2Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  op2Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  opInst.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  opInst.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ec = op;
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_98,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar1 = LeftValueToLabelId(this,(LeftVal *)&local_98);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  __p->id = uVar1;
  std::__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::VarId,void>
            ((__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2> *)auStack_108,__p);
  std::__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2> *)auStack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_108 + 8));
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_98);
  rightValueToValue((irGenerator *)auStack_108,(RightVal *)this);
  std::__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&op1Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> *)auStack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_108 + 8));
  rightValueToValue((irGenerator *)auStack_108,(RightVal *)this);
  std::__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&op2Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2> *)auStack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_108 + 8));
  this_00 = (OpInst *)operator_new(0x60);
  local_a8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_a8.id = (destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->id;
  mir::inst::Value::Value
            (&local_50,
             op1Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  mir::inst::Value::Value
            (&local_70,
             op2Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  mir::inst::OpInst::OpInst(this_00,&local_a8,&local_50,&local_70,local_ec);
  std::__shared_ptr<mir::inst::OpInst,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::OpInst,void>
            ((__shared_ptr<mir::inst::OpInst,(__gnu_cxx::_Lock_policy)2> *)auStack_108,this_00);
  std::__shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&opInst.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2> *)auStack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_108 + 8));
  this_01 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::variant<std::shared_ptr<mir::inst::OpInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
            ((variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
              *)auStack_108,&opInst);
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_01,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)auStack_108);
  std::__detail::__variant::
  _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)auStack_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&opInst.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&op2Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&op1Value.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void irGenerator::ir_op(LeftVal dest, RightVal op1, RightVal op2,
                        mir::inst::Op op) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> op1Value;
  shared_ptr<Value> op2Value;
  shared_ptr<mir::inst::OpInst> opInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  op1Value = rightValueToValue(op1);
  op2Value = rightValueToValue(op2);

  opInst = shared_ptr<mir::inst::OpInst>(
      new mir::inst::OpInst(*destVarId, *op1Value, *op2Value, op));

  _funcNameToInstructions[_funcStack.back()].push_back(opInst);
}